

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O3

bool __thiscall QNetworkCookieJar::insertCookie(QNetworkCookieJar *this,QNetworkCookie *cookie)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  QList<QNetworkCookie> *this_00;
  long in_FS_OFFSET;
  QDateTime now;
  QDateTime local_40 [8];
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QDateTime::currentDateTimeUtc();
  bVar2 = QNetworkCookie::isSessionCookie(cookie);
  if (bVar2) {
    (**(code **)(*(long *)this + 0x80))(this,cookie);
  }
  else {
    QNetworkCookie::expirationDate((QNetworkCookie *)local_40);
    cVar3 = compareThreeWay(local_40,(QDateTime *)&local_38);
    QDateTime::~QDateTime(local_40);
    (**(code **)(*(long *)this + 0x80))(this,cookie);
    if (cVar3 < '\0') {
      bVar2 = false;
      goto LAB_0018aed3;
    }
  }
  this_00 = (QList<QNetworkCookie> *)(lVar1 + 0x78);
  QtPrivate::QMovableArrayOps<QNetworkCookie>::emplace<QNetworkCookie_const&>
            ((QMovableArrayOps<QNetworkCookie> *)this_00,*(qsizetype *)(lVar1 + 0x88),cookie);
  QList<QNetworkCookie>::end(this_00);
  bVar2 = true;
LAB_0018aed3:
  QDateTime::~QDateTime((QDateTime *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QNetworkCookieJar::insertCookie(const QNetworkCookie &cookie)
{
    Q_D(QNetworkCookieJar);
    const QDateTime now = QDateTime::currentDateTimeUtc();
    bool isDeletion = !cookie.isSessionCookie() &&
                      cookie.expirationDate() < now;

    deleteCookie(cookie);

    if (!isDeletion) {
        d->allCookies += cookie;
        return true;
    }
    return false;
}